

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void leveldb::_Test_IteratorPinsRef::_RunIt(void)

{
  undefined1 local_a8 [8];
  _Test_IteratorPinsRef t;
  
  _Test_IteratorPinsRef((_Test_IteratorPinsRef *)local_a8);
  _Run((_Test_IteratorPinsRef *)local_a8);
  ~_Test_IteratorPinsRef((_Test_IteratorPinsRef *)local_a8);
  return;
}

Assistant:

TEST(DBTest, IteratorPinsRef) {
  Put("foo", "hello");

  // Get iterator that will yield the current contents of the DB.
  Iterator* iter = db_->NewIterator(ReadOptions());

  // Write to force compactions
  Put("foo", "newvalue1");
  for (int i = 0; i < 100; i++) {
    ASSERT_OK(Put(Key(i), Key(i) + std::string(100000, 'v')));  // 100K values
  }
  Put("foo", "newvalue2");

  iter->SeekToFirst();
  ASSERT_TRUE(iter->Valid());
  ASSERT_EQ("foo", iter->key().ToString());
  ASSERT_EQ("hello", iter->value().ToString());
  iter->Next();
  ASSERT_TRUE(!iter->Valid());
  delete iter;
}